

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

UINT8 OPLRead(FM_OPL *OPL,UINT8 a)

{
  UINT8 UVar1;
  OPL_PORTHANDLER_R UNRECOVERED_JUMPTABLE;
  char *format;
  byte bVar2;
  void *pvVar3;
  
  if ((a & 1) == 0) {
    bVar2 = (OPL->statusmask | 0x80) & OPL->status;
    if ((OPL->type & 2) == 0) {
      return bVar2;
    }
    return bVar2 | OPL->deltat->PCM_BSY & 1;
  }
  bVar2 = OPL->address;
  if (bVar2 < 0x19) {
    if (bVar2 == 5) {
      if ((OPL->type & 4) != 0) {
        UNRECOVERED_JUMPTABLE = OPL->keyboardhandler_r;
        if (UNRECOVERED_JUMPTABLE != (OPL_PORTHANDLER_R)0x0) {
          pvVar3 = OPL->keyboard_param;
LAB_001440d3:
          UVar1 = (*UNRECOVERED_JUMPTABLE)(pvVar3);
          return UVar1;
        }
        format = "read unmapped KEYBOARD port\n";
LAB_001440ee:
        emu_logf(&OPL->logger,'\x04',format);
        return '\0';
      }
    }
    else {
      if (bVar2 != 0xf) {
        return 0xff;
      }
      if ((OPL->type & 2) != 0) {
        UVar1 = YM_DELTAT_ADPCM_Read(OPL->deltat);
        return UVar1;
      }
    }
  }
  else if (bVar2 == 0x19) {
    if ((OPL->type & 8) != 0) {
      UNRECOVERED_JUMPTABLE = OPL->porthandler_r;
      if (UNRECOVERED_JUMPTABLE != (OPL_PORTHANDLER_R)0x0) {
        pvVar3 = OPL->port_param;
        goto LAB_001440d3;
      }
      format = "read unmapped I/O port\n";
      goto LAB_001440ee;
    }
  }
  else {
    if (bVar2 != 0x1a) {
      return 0xff;
    }
    if ((OPL->type & 2) != 0) {
      emu_logf(&OPL->logger,'\x04',"A/D conversion is accessed but not implemented !\n");
      return 0x80;
    }
  }
  return '\0';
}

Assistant:

static UINT8 OPLRead(FM_OPL *OPL,UINT8 a)
{
	if( !(a&1) )
	{
		/* status port */

#if BUILD_Y8950
		if(OPL->type&OPL_TYPE_ADPCM)    /* Y8950 */
		{
			return (OPL->status & (OPL->statusmask|0x80)) | (OPL->deltat->PCM_BSY&1);
		}
#endif

		/* OPL and OPL2 */
		return OPL->status & (OPL->statusmask|0x80);
	}

#if BUILD_Y8950
	/* data port */
	switch(OPL->address)
	{
	case 0x05: /* KeyBoard IN */
		if(OPL->type&OPL_TYPE_KEYBOARD)
		{
			if(OPL->keyboardhandler_r)
				return OPL->keyboardhandler_r(OPL->keyboard_param);
			else
				emu_logf(&OPL->logger, DEVLOG_DEBUG, "read unmapped KEYBOARD port\n");
		}
		return 0;

	case 0x0f: /* ADPCM-DATA  */
		if(OPL->type&OPL_TYPE_ADPCM)
		{
			UINT8 val;

			val = YM_DELTAT_ADPCM_Read(OPL->deltat);
			/*emu_logf(&OPL->logger, DEVLOG_DEBUG, "read ADPCM value read=%02x\n",val);*/
			return val;
		}
		return 0;

	case 0x19: /* I/O DATA    */
		if(OPL->type&OPL_TYPE_IO)
		{
			if(OPL->porthandler_r)
				return OPL->porthandler_r(OPL->port_param);
			else
				emu_logf(&OPL->logger, DEVLOG_DEBUG, "read unmapped I/O port\n");
		}
		return 0;
	case 0x1a: /* PCM-DATA    */
		if(OPL->type&OPL_TYPE_ADPCM)
		{
			emu_logf(&OPL->logger, DEVLOG_DEBUG, "A/D conversion is accessed but not implemented !\n");
			return 0x80; /* 2's complement PCM data - result from A/D conversion */
		}
		return 0;
	}
#endif

	return 0xff;
}